

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

size_t duckdb_je_xallocx(void *ptr,size_t size,size_t extra,int flags)

{
  uint64_t uVar1;
  undefined8 uVar2;
  rtree_t *rtree;
  uint in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  long *in_FS_OFFSET;
  rtree_metadata_t rVar3;
  uintptr_t args [4];
  void *excess_start;
  size_t excess_len;
  emap_alloc_ctx_t alloc_ctx;
  edata_t *old_edata;
  _Bool zero;
  size_t alignment;
  size_t old_usize;
  size_t usize;
  tsd_t *tsd;
  _Bool fast;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_metadata_t metadata;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  size_t newsize;
  size_t ret;
  tsd_t *tsd_1;
  uint8_t state_1;
  uint8_t state;
  tsd_t *tsd_2;
  uint8_t state_2;
  uint64_t bytes_before_1;
  te_ctx_t ctx_1;
  uint64_t bytes_before;
  te_ctx_t ctx;
  uint8_t state_3;
  uint8_t state_7;
  uint8_t state_11;
  uint8_t state_15;
  uint8_t state_12;
  uint8_t state_4;
  uint8_t state_13;
  uint8_t state_5;
  uint8_t state_14;
  uint8_t state_6;
  uint8_t state_16;
  uint8_t state_8;
  uint8_t state_17;
  uint8_t state_9;
  uint8_t state_18;
  uint8_t state_10;
  void **in_stack_fffffffffffff688;
  void **usize_00;
  void *in_stack_fffffffffffff690;
  undefined8 in_stack_fffffffffffff698;
  tsd_t *in_stack_fffffffffffff6a0;
  uintptr_t in_stack_fffffffffffff6b0;
  rtree_ctx_t *in_stack_fffffffffffff6b8;
  rtree_t *in_stack_fffffffffffff6c0;
  uint in_stack_fffffffffffff6c8;
  undefined4 in_stack_fffffffffffff6cc;
  undefined1 zero_00;
  undefined7 in_stack_fffffffffffff6d8;
  rtree_t *oldsize;
  tsdn_t *in_stack_fffffffffffff6e8;
  void *ptr_00;
  void *result_raw;
  tsdn_t *in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff700;
  tsd_t *ctx_00;
  tsd_t *in_stack_fffffffffffff748;
  bool local_891;
  uintptr_t local_890;
  rtree_ctx_t local_870;
  emap_t *local_6e8;
  tsd_t *local_6e0;
  rtree_metadata_t local_6d8;
  undefined8 local_6c4;
  undefined4 local_6bc;
  rtree_ctx_t *local_6b8;
  rtree_ctx_t local_6b0;
  szind_t *local_530;
  emap_t *local_520;
  tsd_t *local_518;
  void *local_508;
  byte local_4f9;
  rtree_t *local_4f8;
  ulong local_4f0;
  void *local_4e0;
  tsd_t *ptVar4;
  void *local_4c8;
  tsd_t *local_470;
  rtree_ctx_t *local_440;
  _Bool local_369;
  witness_tsd_t *local_358;
  undefined1 local_320 [16];
  uint64_t *local_310;
  uint64_t *local_300;
  undefined1 local_2f1;
  void *local_2f0;
  tsd_t *local_2e8;
  uint64_t local_2e0;
  undefined1 local_2d8 [16];
  uint64_t *local_2c8;
  uint64_t *local_2b8;
  undefined1 local_2a9;
  void *local_2a8;
  tsd_t *local_2a0;
  tsd_t *local_298;
  tsd_t *local_290;
  tsd_t *local_288;
  tsd_t *local_280;
  undefined1 local_271;
  undefined1 *local_270;
  tsd_t *local_268;
  uint8_t local_259;
  tsd_t *local_258;
  tsd_t *local_250;
  tsd_t *local_248;
  undefined1 local_219;
  undefined1 *local_218;
  tsd_t *local_210;
  uint8_t local_1e1;
  tsd_t *local_1e0;
  tsd_t *local_1d8;
  tsd_t *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  uint64_t local_1b8;
  undefined1 *local_1b0;
  uint64_t local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  uint8_t local_169;
  tsd_t *local_168;
  tsd_t *local_160;
  uint8_t local_139;
  tsd_t *local_138;
  tsd_t *local_130;
  uint8_t local_101;
  tsd_t *local_100;
  tsd_t *local_f8;
  tsd_t *local_f0;
  uint8_t local_e1;
  tsd_t *local_e0;
  tsd_t *local_d8;
  uint8_t local_b1;
  tsd_t *local_b0;
  tsd_t *local_a8;
  uint8_t local_81;
  tsd_t *local_80;
  tsd_t *local_78;
  tsd_t *local_70;
  tsd_t *local_48;
  tsd_t *local_38;
  tsd_t *local_20;
  tsd_t *local_10;
  tsd_t *local_8;
  
  rtree = (rtree_t *)(1L << ((byte)in_ECX & 0x3f) & 0xfffffffffffffffe);
  local_891 = duckdb_je_opt_zero || (in_ECX & 0x40) != 0;
  local_470 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    local_470 = duckdb_je_tsd_fetch_slow
                          (in_stack_fffffffffffff6a0,
                           SUB81((ulong)in_stack_fffffffffffff698 >> 0x38,0));
  }
  local_6e0 = local_470;
  local_6e8 = &duckdb_je_arena_emap_global;
  ctx_00 = local_470;
  if (local_470 == (tsd_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&local_870);
  }
  rtree_read((tsdn_t *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
             in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
  zero_00 = (undefined1)((uint)in_stack_fffffffffffff6cc >> 0x18);
  local_520 = &duckdb_je_arena_emap_global;
  local_530 = (szind_t *)&stack0xfffffffffffff6c8;
  local_440 = &local_6b0;
  local_518 = local_470;
  if (local_470 == (tsd_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(local_440);
  }
  else {
    local_440 = &local_470->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  local_6b8 = local_440;
  rVar3 = rtree_metadata_read(in_stack_fffffffffffff6e8,rtree,
                              (rtree_ctx_t *)CONCAT17(local_891,in_stack_fffffffffffff6d8),local_890
                             );
  local_6d8._0_8_ = rVar3._0_8_;
  local_6c4._0_4_ = local_6d8.szind;
  local_6c4._4_4_ = local_6d8.state;
  uVar2 = local_6c4;
  local_6d8._8_4_ = rVar3._8_4_;
  local_6bc._0_1_ = local_6d8.is_head;
  local_6bc._1_1_ = local_6d8.slab;
  local_6bc._2_2_ = local_6d8._10_2_;
  local_6c4._0_4_ = rVar3.szind;
  local_6d8 = rVar3;
  *local_530 = (szind_t)local_6c4;
  local_6c4 = uVar2;
  *(byte *)(local_530 + 1) = local_6bc._1_1_ & 1;
  result_raw = (void *)duckdb_je_sz_index2size_tab[in_stack_fffffffffffff6c8];
  local_4c8 = result_raw;
  if (in_RSI < 0x7000000000000001) {
    if (0x7000000000000000 - in_RSI < in_RDX) {
      in_RDX = 0x7000000000000000 - in_RSI;
    }
    local_4f9 = local_891 & 1;
    usize_00 = &local_508;
    if (local_470 == (tsd_t *)0x0) {
      local_358 = (witness_tsd_t *)0x0;
    }
    else {
      local_358 = &local_470->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
      local_8 = local_470;
    }
    oldsize = rtree;
    ptr_00 = result_raw;
    local_4f8 = rtree;
    local_4f0 = in_RDX;
    local_4e0 = result_raw;
    ptVar4 = local_470;
    witness_assert_depth_to_rank((witness_tsdn_t *)local_358,WITNESS_RANK_CORE,0);
    if ((rtree == (rtree_t *)0x0) ||
       ((in_RDI & (ulong)((long)&rtree[-1].root[0x3ffff].child.repr + 7U)) == 0)) {
      local_369 = duckdb_je_arena_ralloc_no_move
                            (in_stack_fffffffffffff6f0,ptr_00,(size_t)oldsize,
                             CONCAT17(local_891,in_stack_fffffffffffff6d8),local_890,(_Bool)zero_00,
                             (size_t *)ptVar4);
      rtree = oldsize;
    }
    else {
      local_369 = true;
      usize_00 = in_stack_fffffffffffff688;
      rtree = oldsize;
      local_508 = result_raw;
    }
    result_raw = ptr_00;
    if (local_369 == false) {
      local_4c8 = local_508;
    }
    else {
      local_4c8 = local_4e0;
    }
    if (local_4c8 != result_raw) {
      local_2a8 = local_4c8;
      local_2a9 = 1;
      local_270 = local_2d8;
      local_271 = 1;
      local_2d8[0] = 1;
      local_259 = (local_470->state).repr;
      local_169 = (local_470->state).repr;
      local_2c8 = &local_470->
                   cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event
      ;
      local_139 = (local_470->state).repr;
      local_101 = (local_470->state).repr;
      local_2b8 = &local_470->
                   cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast
      ;
      local_1c8 = local_2d8;
      local_2e0 = local_470->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      local_1b8 = local_2e0 + (long)local_4c8;
      local_1b0 = local_2d8;
      local_470->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = local_1b8;
      local_198 = local_2d8;
      local_2a0 = local_470;
      ptVar4 = local_470;
      local_290 = local_470;
      local_268 = local_470;
      local_258 = local_470;
      local_250 = local_470;
      local_248 = local_470;
      local_168 = local_470;
      local_160 = local_470;
      local_138 = local_470;
      local_130 = local_470;
      local_100 = local_470;
      local_f8 = local_470;
      local_f0 = local_470;
      local_48 = local_470;
      local_38 = local_470;
      if ((void *)(local_470->
                   cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event
                  - local_2e0) <= local_4c8) {
        duckdb_je_te_event_trigger(in_stack_fffffffffffff748,(te_ctx_t *)ctx_00);
        ptVar4 = local_298;
      }
      local_298 = ptVar4;
      local_2f1 = 0;
      local_218 = local_320;
      local_219 = 0;
      local_320[0] = 0;
      local_1e1 = (local_470->state).repr;
      local_e1 = (local_470->state).repr;
      local_310 = &local_470->
                   cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event
      ;
      local_b1 = (local_470->state).repr;
      local_81 = (local_470->state).repr;
      local_300 = &local_470->
                   cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
      ;
      local_1c0 = local_320;
      uVar1 = local_470->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      local_1a8 = uVar1 + (long)result_raw;
      local_1a0 = local_320;
      local_470->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated =
           local_1a8;
      local_190 = local_320;
      local_2f0 = result_raw;
      local_2e8 = local_470;
      ptVar4 = local_470;
      local_280 = local_470;
      local_210 = local_470;
      local_1e0 = local_470;
      local_1d8 = local_470;
      local_1d0 = local_470;
      local_e0 = local_470;
      local_d8 = local_470;
      local_b0 = local_470;
      local_a8 = local_470;
      local_80 = local_470;
      local_78 = local_470;
      local_70 = local_470;
      local_20 = local_470;
      local_10 = local_470;
      if ((void *)(local_470->
                   cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event
                  - uVar1) <= result_raw) {
        duckdb_je_te_event_trigger(in_stack_fffffffffffff748,(te_ctx_t *)ctx_00);
        ptVar4 = local_288;
      }
      local_288 = ptVar4;
      if ((((duckdb_je_opt_junk_alloc & 1U) != 0) && (result_raw < local_4c8)) &&
         ((local_891 & 1U) == 0)) {
        default_junk_alloc(in_stack_fffffffffffff690,(size_t)usize_00);
      }
    }
  }
  if ((local_470->state).repr != '\0') {
    duckdb_je_hook_invoke_expand
              ((hook_expand_t)(in_RDX >> 0x20),(void *)CONCAT44(in_ECX,in_stack_fffffffffffff700),
               (size_t)local_470,(size_t)local_4c8,(uintptr_t)result_raw,(uintptr_t *)rtree);
  }
  return (size_t)local_4c8;
}

Assistant:

JEMALLOC_NOTHROW
je_xallocx(void *ptr, size_t size, size_t extra, int flags) {
	tsd_t *tsd;
	size_t usize, old_usize;
	size_t alignment = MALLOCX_ALIGN_GET(flags);
	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	LOG("core.xallocx.entry", "ptr: %p, size: %zu, extra: %zu, "
	    "flags: %d", ptr, size, extra, flags);

	assert(ptr != NULL);
	assert(size != 0);
	assert(SIZE_T_MAX - size >= extra);
	assert(malloc_initialized() || IS_INITIALIZER);
	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	/*
	 * old_edata is only for verifying that xallocx() keeps the edata_t
	 * object associated with the ptr (though the content of the edata_t
	 * object can be changed).
	 */
	edata_t *old_edata = emap_edata_lookup(tsd_tsdn(tsd),
	    &arena_emap_global, ptr);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
	    &alloc_ctx);
	assert(alloc_ctx.szind != SC_NSIZES);
	old_usize = sz_index2size(alloc_ctx.szind);
	assert(old_usize == isalloc(tsd_tsdn(tsd), ptr));
	/*
	 * The API explicitly absolves itself of protecting against (size +
	 * extra) numerical overflow, but we may need to clamp extra to avoid
	 * exceeding SC_LARGE_MAXCLASS.
	 *
	 * Ordinarily, size limit checking is handled deeper down, but here we
	 * have to check as part of (size + extra) clamping, since we need the
	 * clamped value in the above helper functions.
	 */
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		usize = old_usize;
		goto label_not_resized;
	}
	if (unlikely(SC_LARGE_MAXCLASS - size < extra)) {
		extra = SC_LARGE_MAXCLASS - size;
	}

	if (config_prof && opt_prof) {
		usize = ixallocx_prof(tsd, ptr, old_usize, size, extra,
		    alignment, zero, &alloc_ctx);
	} else {
		usize = ixallocx_helper(tsd_tsdn(tsd), ptr, old_usize, size,
		    extra, alignment, zero);
	}

	/*
	 * xallocx() should keep using the same edata_t object (though its
	 * content can be changed).
	 */
	assert(emap_edata_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr)
	    == old_edata);

	if (unlikely(usize == old_usize)) {
		goto label_not_resized;
	}
	thread_alloc_event(tsd, usize);
	thread_dalloc_event(tsd, old_usize);

	if (config_fill && unlikely(opt_junk_alloc) && usize > old_usize &&
	    !zero) {
		size_t excess_len = usize - old_usize;
		void *excess_start = (void *)((byte_t *)ptr + old_usize);
		junk_alloc_callback(excess_start, excess_len);
	}
label_not_resized:
	if (unlikely(!tsd_fast(tsd))) {
		uintptr_t args[4] = {(uintptr_t)ptr, size, extra, flags};
		hook_invoke_expand(hook_expand_xallocx, ptr, old_usize,
		    usize, (uintptr_t)usize, args);
	}

	UTRACE(ptr, size, ptr);
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.xallocx.exit", "result: %zu", usize);
	return usize;
}